

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::validateEquivalenceUnits
          (ValidatorImpl *this,ModelPtr *model,VariablePtr *variable,VariableMap *alreadyReported)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__x;
  IssueImpl *this_00;
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  undefined1 local_3c0 [16];
  string local_3b0;
  string local_390;
  string local_370;
  undefined1 local_350 [16];
  string local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  IssuePtr err;
  VariablePairPtr pair;
  anon_class_32_2_f86da958_for__M_pred local_118;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  local_f8;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  local_f0;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  local_e8;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  it;
  double multiplier;
  shared_ptr<const_libcellml::ParentedEntity> local_c8;
  undefined1 local_b8 [8];
  ComponentPtr equivalentComponent;
  VariablePtr equivalentVariable;
  size_t index;
  Variable local_88;
  shared_ptr<const_libcellml::ParentedEntity> local_68;
  undefined1 local_58 [8];
  ComponentPtr parentComponent;
  string hints;
  VariableMap *alreadyReported_local;
  VariablePtr *variable_local;
  ModelPtr *model_local;
  ValidatorImpl *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &parentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_68,variable);
  owningComponent((libcellml *)local_58,(ParentedEntityConstPtr *)&local_68);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_68);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             variable);
  Variable::units(&local_88);
  bVar1 = std::operator==((shared_ptr<libcellml::Units> *)&local_88,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&local_88);
  if (!bVar1) {
    equivalentVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      peVar2 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               Variable::equivalentVariableCount(peVar2);
      if (p_Var3 <= equivalentVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi) break;
      peVar2 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
      Variable::equivalentVariable
                ((Variable *)
                 &equivalentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (size_t)peVar2);
      std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
                ((shared_ptr<libcellml::ParentedEntity_const> *)&local_c8,
                 (shared_ptr<libcellml::Variable> *)
                 &equivalentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      owningComponent((libcellml *)local_b8,(ParentedEntityConstPtr *)&local_c8);
      std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_c8);
      bVar1 = std::operator==((shared_ptr<libcellml::Component> *)local_b8,(nullptr_t)0x0);
      if (!bVar1) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b8);
        bVar1 = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
        if (!bVar1) {
          std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&equivalentComponent.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
          Variable::units((Variable *)&multiplier);
          bVar1 = std::operator==((shared_ptr<libcellml::Units> *)&multiplier,(nullptr_t)0x0);
          std::shared_ptr<libcellml::Units>::~shared_ptr
                    ((shared_ptr<libcellml::Units> *)&multiplier);
          if (!bVar1) {
            it._M_current = (shared_ptr<libcellml::VariablePair> *)0x0;
            bVar1 = unitsAreEquivalent(model,variable,
                                       (VariablePtr *)
                                       &equivalentComponent.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,
                                       (string *)
                                       &parentComponent.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,(double *)&it);
            if (!bVar1) {
              local_f0._M_current =
                   (shared_ptr<libcellml::VariablePair> *)
                   std::
                   vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                   ::begin(alreadyReported);
              local_f8._M_current =
                   (shared_ptr<libcellml::VariablePair> *)
                   std::
                   vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                   ::end(alreadyReported);
              std::shared_ptr<libcellml::Variable>::shared_ptr
                        (&local_118.equivalentVariable,
                         (shared_ptr<libcellml::Variable> *)
                         &equivalentComponent.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::shared_ptr<libcellml::Variable>::shared_ptr(&local_118.variable,variable);
              local_e8 = std::
                         find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::VariablePair>*,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>>,libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                   (local_f0,local_f8,&local_118);
              validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
              ::$_0::~__0((__0 *)&local_118);
              pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   std::
                   vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                   ::end(alreadyReported);
              bVar1 = __gnu_cxx::operator==
                                (&local_e8,
                                 (__normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
                                  *)&pair.
                                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
              if (bVar1) {
                __x = &err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
                VariablePair::create
                          ((VariablePair *)__x,variable,
                           (VariablePtr *)
                           &equivalentComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::
                vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                ::push_back(alreadyReported,(value_type *)__x);
                Issue::IssueImpl::create();
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_140);
                this_00 = peVar5->mPimpl;
                peVar2 = std::
                         __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)variable);
                NamedEntity::name_abi_cxx11_(&local_300,&peVar2->super_NamedEntity);
                std::operator+(&local_2e0,"Variable \'",&local_300);
                std::operator+(&local_2c0,&local_2e0,"\' in component \'");
                peVar4 = std::
                         __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_58);
                NamedEntity::name_abi_cxx11_(&local_320,(NamedEntity *)peVar4);
                std::operator+(&local_2a0,&local_2c0,&local_320);
                std::operator+(&local_280,&local_2a0,"\' has units of \'");
                std::
                __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)variable);
                Variable::units((Variable *)local_350);
                peVar6 = std::
                         __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_350);
                NamedEntity::name_abi_cxx11_
                          ((string *)(local_350 + 0x10),&peVar6->super_NamedEntity);
                std::operator+(&local_260,&local_280,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_350 + 0x10));
                std::operator+(&local_240,&local_260,"\' and an equivalent variable \'");
                peVar2 = std::
                         __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&equivalentComponent.
                                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                NamedEntity::name_abi_cxx11_(&local_370,&peVar2->super_NamedEntity);
                std::operator+(&local_220,&local_240,&local_370);
                std::operator+(&local_200,&local_220,"\' in component \'");
                peVar4 = std::
                         __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_b8);
                NamedEntity::name_abi_cxx11_(&local_390,(NamedEntity *)peVar4);
                std::operator+(&local_1e0,&local_200,&local_390);
                std::operator+(&local_1c0,&local_1e0,"\' with non-matching units of \'");
                std::
                __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&equivalentComponent.
                               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
                Variable::units((Variable *)local_3c0);
                peVar6 = std::
                         __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_3c0);
                NamedEntity::name_abi_cxx11_
                          ((string *)(local_3c0 + 0x10),&peVar6->super_NamedEntity);
                std::operator+(&local_1a0,&local_1c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_3c0 + 0x10));
                std::operator+(&local_180,&local_1a0,"\'. The mismatch is: ");
                std::operator+(&local_160,&local_180,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &parentComponent.
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                Issue::IssueImpl::setDescription(this_00,&local_160);
                std::__cxx11::string::~string((string *)&local_160);
                std::__cxx11::string::~string((string *)&local_180);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::~string((string *)(local_3c0 + 0x10));
                std::shared_ptr<libcellml::Units>::~shared_ptr
                          ((shared_ptr<libcellml::Units> *)local_3c0);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::__cxx11::string::~string((string *)&local_1e0);
                std::__cxx11::string::~string((string *)&local_390);
                std::__cxx11::string::~string((string *)&local_200);
                std::__cxx11::string::~string((string *)&local_220);
                std::__cxx11::string::~string((string *)&local_370);
                std::__cxx11::string::~string((string *)&local_240);
                std::__cxx11::string::~string((string *)&local_260);
                std::__cxx11::string::~string((string *)(local_350 + 0x10));
                std::shared_ptr<libcellml::Units>::~shared_ptr
                          ((shared_ptr<libcellml::Units> *)local_350);
                std::__cxx11::string::~string((string *)&local_280);
                std::__cxx11::string::~string((string *)&local_2a0);
                std::__cxx11::string::~string((string *)&local_320);
                std::__cxx11::string::~string((string *)&local_2c0);
                std::__cxx11::string::~string((string *)&local_2e0);
                std::__cxx11::string::~string((string *)&local_300);
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_140);
                peVar7 = std::
                         __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar5->mPimpl->mItem);
                AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                          (peVar7->mPimpl,variable,
                           (VariablePtr *)
                           &equivalentComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_140);
                Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,MAP_VARIABLES_ELEMENT);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_140);
                std::shared_ptr<libcellml::Issue>::~shared_ptr
                          ((shared_ptr<libcellml::Issue> *)local_140);
                std::shared_ptr<libcellml::VariablePair>::~shared_ptr
                          ((shared_ptr<libcellml::VariablePair> *)
                           &err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
            }
          }
        }
      }
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)local_b8);
      std::shared_ptr<libcellml::Variable>::~shared_ptr
                ((shared_ptr<libcellml::Variable> *)
                 &equivalentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      equivalentVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(equivalentVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1);
    }
  }
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &parentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateEquivalenceUnits(const ModelPtr &model, const VariablePtr &variable, VariableMap &alreadyReported)
{
    std::string hints;
    ComponentPtr parentComponent = owningComponent(variable);

    if (variable->units() == nullptr) {
        // If the variable has no units, don't check it.
        return;
    }

    for (size_t index = 0; index < variable->equivalentVariableCount(); ++index) {
        auto equivalentVariable = variable->equivalentVariable(index);

        // If the parent component of the variable is nonexistent or imported, don't check it.
        auto equivalentComponent = owningComponent(equivalentVariable);
        if ((equivalentComponent == nullptr) || equivalentComponent->isImport()) {
            continue;
        }

        // If the equivalent variable has no units, don't check it.
        if (equivalentVariable->units() == nullptr) {
            continue;
        }

        double multiplier = 0.0;
        if (!unitsAreEquivalent(model, variable, equivalentVariable, hints, multiplier)) {
            auto it = std::find_if(alreadyReported.begin(), alreadyReported.end(),
                                   [equivalentVariable, variable](const VariablePairPtr &in) {
                                       return (in->variable1() == equivalentVariable) && (in->variable2() == variable);
                                   });
            if (it == alreadyReported.end()) {
                VariablePairPtr pair = VariablePair::create(variable, equivalentVariable);
                alreadyReported.push_back(pair);
                IssuePtr err = Issue::IssueImpl::create();
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + parentComponent->name() + "' has units of '" + variable->units()->name() + "' and an equivalent variable '" + equivalentVariable->name() + "' in component '" + equivalentComponent->name() + "' with non-matching units of '" + equivalentVariable->units()->name() + "'. The mismatch is: " + hints);
                err->mPimpl->mItem->mPimpl->setMapVariables(variable, equivalentVariable);
                err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
                addIssue(err);
            }
        }
    }
}